

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

Test * __thiscall
testing::internal::ParameterizedTestFactory<(anonymous_namespace)::CFLPredictTest_PredictTest_Test>
::CreateTest(ParameterizedTestFactory<(anonymous_namespace)::CFLPredictTest_PredictTest_Test> *this)

{
  Test *this_00;
  long in_RDI;
  
  WithParamInterface<std::tuple<unsigned_char,_void_(*(*)(unsigned_char))(const_short_*,_unsigned_char_*,_int,_int)>_>
  ::SetParam((ParamType *)(in_RDI + 8));
  this_00 = (Test *)operator_new(0x68);
  anon_unknown.dwarf_15b07f::CFLPredictTest_PredictTest_Test::CFLPredictTest_PredictTest_Test
            ((CFLPredictTest_PredictTest_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }